

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_publish2process(fio_msg_internal_s *m)

{
  size_t *psVar1;
  uint uVar2;
  fio_defer_task_s task;
  fio_defer_task_s task_00;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [24];
  fio_lock_i fVar6;
  int iVar7;
  channel_s *pcVar8;
  uint64_t hashed;
  fio_ch_set__ordered_s_ *pfVar9;
  fio_lock_i ret;
  uint local_ac;
  code *local_a8;
  channel_s *pcStack_a0;
  fio_msg_internal_s *local_98;
  undefined8 local_90;
  size_t sStack_88;
  char *local_80;
  code *local_78;
  channel_s *pcStack_70;
  fio_msg_internal_s *local_68;
  channel_s local_60;
  
  local_60.name_len = (m->channel).len;
  if (local_60.name_len == 0) {
    (m->channel).data = (char *)0x0;
  }
  if ((m->data).len == 0) {
    (m->data).data = (char *)0x0;
  }
  uVar2 = m->filter;
  if ((ulong)uVar2 == 0) {
    local_60.name = (m->channel).data;
    local_60.match = (fio_match_fn)0x0;
    local_60.lock = '\0';
    local_60._57_7_ = 0;
    local_60.subscriptions.next = (fio_ls_embd_s *)0x0;
    local_60.parent = (fio_collection_s *)0x0;
    local_60.ref = 0;
    local_60.subscriptions.prev = (fio_ls_embd_s *)0x0;
    hashed = fio_siphash13(local_60.name,local_60.name_len,0x17fb68,0x17fb68);
    pcVar8 = fio_channel_find_dup_internal(&local_60,hashed,&fio_postoffice.pubsub);
    if (pcVar8 != (channel_s *)0x0) goto LAB_0012c00d;
  }
  else {
    local_60.name = (char *)&local_ac;
    local_60.match = (fio_match_fn)0x0;
    local_60.lock = '\0';
    local_60._57_7_ = 0;
    local_60.subscriptions.next = (fio_ls_embd_s *)0x0;
    local_60.parent = (fio_collection_s *)0x0;
    local_60.ref = 0;
    local_60.subscriptions.prev = (fio_ls_embd_s *)0x0;
    local_60.name_len = 4;
    local_ac = uVar2;
    pcVar8 = fio_channel_find_dup_internal(&local_60,(ulong)uVar2,&fio_postoffice.filters);
    if (pcVar8 == (channel_s *)0x0) goto LAB_0012c141;
LAB_0012c00d:
    local_78 = fio_publish2channel_task;
    LOCK();
    m->ref = m->ref + 1;
    UNLOCK();
    task.arg1 = pcVar8;
    task.func = fio_publish2channel_task;
    task.arg2 = m;
    pcStack_70 = pcVar8;
    local_68 = m;
    fio_defer_push_task_fn(task,&task_queue_urgent);
  }
  if (m->filter == 0) {
    fio_lock(&fio_postoffice.patterns.lock);
    for (pfVar9 = fio_postoffice.patterns.channels.ordered;
        (fVar6 = fio_postoffice.patterns.lock, pfVar9 != (fio_ch_set__ordered_s_ *)0x0 &&
        (pfVar9 < fio_postoffice.patterns.channels.ordered + fio_postoffice.patterns.channels.pos));
        pfVar9 = pfVar9 + 1) {
      if (pfVar9->hash != 0) {
        pcVar8 = pfVar9->obj;
        local_90 = 0;
        sStack_88 = pcVar8->name_len;
        local_80 = pcVar8->name;
        uVar3 = pcVar8->name_len;
        uVar4 = pcVar8->name;
        auVar5._8_8_ = uVar4;
        auVar5._0_8_ = uVar3;
        auVar5._16_8_ = 0;
        iVar7 = (*pcVar8->match)((fio_str_info_s)(auVar5 << 0x40),m->channel);
        if (iVar7 != 0) {
          if (pfVar9->obj == (channel_s *)0x0) {
            pcStack_a0 = (channel_s *)0x0;
          }
          else {
            LOCK();
            psVar1 = &pfVar9->obj->ref;
            *psVar1 = *psVar1 + 1;
            UNLOCK();
            pcStack_a0 = pfVar9->obj;
          }
          local_a8 = fio_publish2channel_task;
          LOCK();
          m->ref = m->ref + 1;
          UNLOCK();
          task_00.arg1 = pcStack_a0;
          task_00.func = fio_publish2channel_task;
          task_00.arg2 = m;
          local_98 = m;
          fio_defer_push_task_fn(task_00,&task_queue_urgent);
        }
      }
    }
    LOCK();
    fio_postoffice.patterns.lock = '\0';
    UNLOCK();
    local_60.name_len = CONCAT71(local_60.name_len._1_7_,fVar6);
  }
LAB_0012c141:
  fio_msg_internal_free(m);
  return;
}

Assistant:

static void fio_publish2process(fio_msg_internal_s *m) {
  fio_msg_internal_finalize(m);
  channel_s *ch;
  if (m->filter) {
    ch = fio_filter_find_dup(m->filter);
    if (!ch) {
      goto finish;
    }
  } else {
    ch = fio_channel_find_dup(m->channel);
  }
  /* exact match */
  if (ch) {
    fio_defer_push_urgent(fio_publish2channel_task, ch,
                          fio_msg_internal_dup(m));
  }
  if (m->filter == 0) {
    /* pattern matching match */
    fio_lock(&fio_postoffice.patterns.lock);
    FIO_SET_FOR_LOOP(&fio_postoffice.patterns.channels, p) {
      if (!p->hash) {
        continue;
      }

      if (p->obj->match(
              (fio_str_info_s){.data = p->obj->name, .len = p->obj->name_len},
              m->channel)) {
        fio_channel_dup(p->obj);
        fio_defer_push_urgent(fio_publish2channel_task, p->obj,
                              fio_msg_internal_dup(m));
      }
    }
    fio_unlock(&fio_postoffice.patterns.lock);
  }
finish:
  fio_msg_internal_free(m);
}